

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_scene.hpp
# Opt level: O3

hit_list<double> * mesh_scene(void)

{
  vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_> *this;
  hit_list<double> *in_RDI;
  undefined1 local_b1;
  int local_b0 [2];
  vec3<double> local_a8;
  sphere<double> *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  shared_ptr<diffuse<double>_> local_70;
  int local_5c;
  value_type local_58;
  value_type local_48;
  value_type local_38;
  
  (in_RDI->super_hit<double>)._vptr_hit = (_func_int **)&PTR_is_hit_0010e8f0;
  this = &in_RDI->obj_list;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->obj_list).
  super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.e[0] = 0.0;
  local_a8.e[1] = -1000.0;
  local_a8.e[2] = 0.0;
  local_b0[1] = 1000;
  local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse<double>,std::allocator<diffuse<double>>,std::shared_ptr<checker<double>>&>
            (&local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse<double> **)&local_70,(allocator<diffuse<double>_> *)local_b0,&mat_checker);
  local_88 = (sphere<double> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere<double>,std::allocator<sphere<double>>,vec3<double>,int,std::shared_ptr<diffuse<double>>>
            (a_Stack_80,&local_88,(allocator<sphere<double>_> *)local_b0,&local_a8,local_b0 + 1,
             &local_70);
  local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_88->super_hit<double>;
  local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_80[0]._M_pi;
  local_88 = (sphere<double> *)0x0;
  a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,&local_38);
  if (local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
  }
  if (local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_70.super___shared_ptr<diffuse<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                _4_4_,0xfffffea9);
  local_b0[1] = 0x157;
  local_b0[0] = -0x14c;
  local_5c = 0x14c;
  local_88 = (sphere<double> *)0x408125999999999a;
  local_a8.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rectangle<double>,std::allocator<xz_rectangle<double>>,int,int,int,int,double,std::shared_ptr<diffuse_light<double>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8.e + 1),
             (xz_rectangle<double> **)&local_a8,(allocator<xz_rectangle<double>_> *)&local_b1,
             (int *)&local_70,local_b0 + 1,local_b0,&local_5c,(double *)&local_88,&light);
  local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8.e[0];
  local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1];
  local_a8.e[0] = 0.0;
  local_a8.e[1] = 0.0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,&local_48);
  if (local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1]);
  }
  local_a8.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mesh<double>,std::allocator<mesh<double>>,char_const(&)[10],std::shared_ptr<diffuse<double>>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8.e + 1),
             (mesh<double> **)&local_a8,(allocator<mesh<double>_> *)&local_88,
             (char (*) [10])"bunny.obj",&red);
  local_58.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8.e[0];
  local_58.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1];
  local_a8.e[0] = 0.0;
  local_a8.e[1] = 0.0;
  std::vector<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>::
  push_back(this,&local_58);
  if (local_58.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.e[1]);
  }
  return in_RDI;
}

Assistant:

hit_list<datatype> mesh_scene() {
  hit_list<datatype> objects;

  objects.add(std::make_shared<sphere<datatype>>(
      point3<datatype>(0, -1000, 0), 1000,
      std::make_shared<diffuse<datatype>>(mat_checker)));

  objects.add(std::make_shared<xz_rectangle<datatype>>(-343, 343, -332, 332,
                                                       548.7, light));
  objects.add(std::make_shared<mesh<datatype>>("bunny.obj", red));

  return objects;
}